

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetMethodElement_UInt32
              (Var instance,uint32 index,ScriptContext *scriptContext)

{
  Var pvVar1;
  ScriptContext *scriptContext_local;
  uint32 index_local;
  Var instance_local;
  
  pvVar1 = JavascriptNumber::ToVar(index,scriptContext);
  pvVar1 = OP_GetMethodElement(instance,pvVar1,scriptContext);
  return pvVar1;
}

Assistant:

Var JavascriptOperators::OP_GetMethodElement_UInt32(Var instance, uint32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetMethodElement_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_GetMethodElement_UInt32, Op_GetMethodElement);
#if FLOATVAR
        return OP_GetMethodElement(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetMethodElement(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_GetMethodElement_UInt32);
    }